

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O2

void duckdb::ArgMinMaxBase<duckdb::LessThan,true>::
     Combine<duckdb::ArgMinMaxState<duckdb::hugeint_t,int>,duckdb::ArgMinMaxBase<duckdb::LessThan,true>>
               (ArgMinMaxState<duckdb::hugeint_t,_int> *source,
               ArgMinMaxState<duckdb::hugeint_t,_int> *target,AggregateInputData *param_3)

{
  int64_t iVar1;
  int iVar2;
  
  if ((source->super_ArgMinMaxStateBase).is_initialized != true) {
    return;
  }
  if ((target->super_ArgMinMaxStateBase).is_initialized == false) {
    iVar2 = source->value;
  }
  else {
    iVar2 = source->value;
    if (target->value <= iVar2) {
      return;
    }
  }
  iVar1 = (source->arg).upper;
  (target->arg).lower = (source->arg).lower;
  (target->arg).upper = iVar1;
  target->value = iVar2;
  (target->super_ArgMinMaxStateBase).is_initialized = true;
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (!source.is_initialized) {
			return;
		}
		if (!target.is_initialized || COMPARATOR::Operation(source.value, target.value)) {
			Assign(target, source.arg, source.value, source.arg_null);
			target.is_initialized = true;
		}
	}